

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::OpenSSLClient::OpenSSLClient
          (OpenSSLClient *this,string *host,int port,milliseconds read_timeout)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  SSL_CTX *pSVar2;
  string local_68;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__OpenSSLClient_001e7eb8;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  if (Log == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OpenSSLClient","");
    LoggerFactory::GetLogger((LoggerFactory *)&local_48,&local_68);
    p_Var1 = p_Stack_40;
    Log = local_48;
    this_00 = DAT_001edf90;
    local_48 = 0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_001edf90 = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  OPENSSL_init_ssl(0,0);
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = port;
  (this->read_timeout_).__r = read_timeout.__r;
  pSVar2 = InitCTX(this);
  this->ctx_ = pSVar2;
  return;
}

Assistant:

OpenSSLClient::OpenSSLClient(std::string host, int port, std::chrono::milliseconds read_timeout) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("OpenSSLClient");
    }
    SSL_library_init();
    host_ = std::move(host);
    port_ = port;
    read_timeout_ = read_timeout;
    ctx_ = InitCTX();
}